

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O2

ECDSA_SIG * gost_ec_sign(uchar *dgst,int dlen,EC_KEY *eckey)

{
  int iVar1;
  BN_CTX *ctx;
  BIGNUM *m;
  ECDSA_SIG *sig;
  EC_GROUP *group;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  BIGNUM *rem;
  BIGNUM *rnd;
  EC_POINT *r;
  int iVar4;
  ECDSA_SIG *pEVar5;
  BIGNUM *local_78;
  BIGNUM *local_70;
  BIGNUM *local_68;
  BIGNUM *local_60;
  BIGNUM *local_40;
  
  if ((dgst == (uchar *)0x0) || (eckey == (EC_KEY *)0x0)) {
    OPENSSL_die("assertion failed: dgst != NULL && eckey != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                ,0xc5);
  }
  ctx = (BN_CTX *)BN_CTX_secure_new();
  if (ctx == (BN_CTX *)0x0) {
    ERR_GOST_error(0x6d,0xc0100,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,200);
    return (ECDSA_SIG *)0x0;
  }
  BN_CTX_start(ctx);
  if ((dlen != 0x20) && (dlen != 0x40)) {
    OPENSSL_die("assertion failed: dlen == 32 || dlen == 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                ,0xcd);
  }
  m = (BIGNUM *)BN_lebin2bn(dgst,dlen,0);
  sig = ECDSA_SIG_new();
  if (sig == (ECDSA_SIG *)0x0 || m == (BIGNUM *)0x0) {
    iVar4 = 0xc0100;
    iVar1 = 0xd1;
  }
  else {
    group = EC_KEY_get0_group((EC_KEY *)eckey);
    if (group == (EC_GROUP *)0x0) {
      iVar4 = 0xc0103;
      iVar1 = 0xd6;
    }
    else {
      pBVar2 = BN_CTX_get(ctx);
      if ((pBVar2 == (BIGNUM *)0x0) || (iVar1 = EC_GROUP_get_order(group,pBVar2,ctx), iVar1 == 0)) {
        iVar4 = 0xc0103;
        iVar1 = 0xdb;
      }
      else {
        pBVar3 = EC_KEY_get0_private_key((EC_KEY *)eckey);
        if (pBVar3 == (BIGNUM *)0x0) {
          iVar4 = 0xc0103;
          iVar1 = 0xe0;
        }
        else {
          rem = BN_CTX_get(ctx);
          if ((rem != (BIGNUM *)0x0) && (iVar1 = BN_div((BIGNUM *)0x0,rem,m,pBVar2,ctx), iVar1 != 0)
             ) {
            iVar1 = BN_is_zero();
            if (iVar1 != 0) {
              BN_set_word(rem,1);
            }
            rnd = BN_CTX_get(ctx);
            r = EC_POINT_new(group);
            if (r == (EC_POINT *)0x0 || rnd == (BIGNUM *)0x0) {
              iVar4 = 0xc0100;
              iVar1 = 0xf5;
            }
            else {
              local_60 = (BIGNUM *)0x0;
              local_78 = (BIGNUM *)0x0;
              local_40 = (BIGNUM *)0x0;
              local_68 = (BIGNUM *)0x0;
              local_70 = (BIGNUM *)0x0;
              do {
                do {
                  iVar1 = BN_rand_range(rnd,pBVar2);
                  if (iVar1 == 0) {
                    iVar4 = 0x7e;
                    iVar1 = 0xfc;
                    goto LAB_0011d5a7;
                  }
                  iVar1 = gost_ec_point_mul((EC_GROUP *)group,(EC_POINT *)r,(BIGNUM *)rnd,
                                            (EC_POINT *)0x0,(BIGNUM *)0x0,(BN_CTX *)ctx);
                  if (iVar1 == 0) {
                    iVar4 = 0x80010;
                    iVar1 = 0x100;
                    goto LAB_0011d5a7;
                  }
                  if (local_40 == (BIGNUM *)0x0) {
                    local_40 = BN_CTX_get(ctx);
                  }
                  if (local_60 == (BIGNUM *)0x0) {
                    local_60 = BN_CTX_get(ctx);
                  }
                  if ((local_40 == (BIGNUM *)0x0) || (local_60 == (BIGNUM *)0x0)) {
                    iVar4 = 0xc0100;
                    iVar1 = 0x108;
                    goto LAB_0011d5a7;
                  }
                  iVar1 = EC_POINT_get_affine_coordinates(group,r,local_40,0);
                  if (iVar1 == 0) {
                    iVar4 = 0x80010;
                    iVar1 = 0x10c;
                    goto LAB_0011d5a7;
                  }
                  iVar1 = BN_nnmod(local_60,local_40,pBVar2,ctx);
                  if (iVar1 == 0) {
                    iVar4 = 0xc0103;
                    iVar1 = 0x111;
                    goto LAB_0011d5a7;
                  }
                  iVar1 = BN_is_zero(local_60);
                } while (iVar1 != 0);
                if (local_68 == (BIGNUM *)0x0) {
                  local_68 = BN_CTX_get(ctx);
                }
                if (local_70 == (BIGNUM *)0x0) {
                  local_70 = BN_CTX_get(ctx);
                }
                if (local_78 == (BIGNUM *)0x0) {
                  local_78 = BN_CTX_get(ctx);
                }
                if (((local_68 == (BIGNUM *)0x0) || (local_70 == (BIGNUM *)0x0)) ||
                   (local_78 == (BIGNUM *)0x0)) {
                  iVar4 = 0xc0100;
                  iVar1 = 0x11e;
                  goto LAB_0011d5a7;
                }
                iVar1 = BN_mod_mul(local_68,pBVar3,local_60,pBVar2,ctx);
                if (((iVar1 == 0) || (iVar1 = BN_mod_mul(local_70,rnd,rem,pBVar2,ctx), iVar1 == 0))
                   || (iVar1 = BN_mod_add(local_78,local_68,local_70,pBVar2,ctx), iVar1 == 0)) {
                  iVar4 = 0xc0103;
                  iVar1 = 0x125;
                  goto LAB_0011d5a7;
                }
                iVar1 = BN_is_zero(local_78);
              } while (iVar1 != 0);
              pBVar2 = BN_dup(local_78);
              pBVar3 = BN_dup(local_60);
              if (pBVar2 != (BIGNUM *)0x0 && pBVar3 != (BIGNUM *)0x0) {
                ECDSA_SIG_set0(sig,pBVar3,pBVar2);
                pEVar5 = sig;
                goto LAB_0011d50d;
              }
              iVar4 = 0xc0100;
              iVar1 = 0x12e;
            }
LAB_0011d5a7:
            ERR_GOST_error(0x6d,iVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                           ,iVar1);
            pEVar5 = (ECDSA_SIG *)0x0;
            goto LAB_0011d50d;
          }
          iVar4 = 0xc0103;
          iVar1 = 0xe5;
        }
      }
    }
  }
  ERR_GOST_error(0x6d,iVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                 ,iVar1);
  pEVar5 = (ECDSA_SIG *)0x0;
  r = (EC_POINT *)0x0;
LAB_0011d50d:
  BN_CTX_end(ctx);
  BN_CTX_free(ctx);
  if (r != (EC_POINT *)0x0) {
    EC_POINT_free(r);
  }
  if (m != (BIGNUM *)0x0) {
    BN_free(m);
  }
  if (pEVar5 == (ECDSA_SIG *)0x0 && sig != (ECDSA_SIG *)0x0) {
    ECDSA_SIG_free(sig);
    return (ECDSA_SIG *)0x0;
  }
  return (ECDSA_SIG *)pEVar5;
}

Assistant:

ECDSA_SIG *gost_ec_sign(const unsigned char *dgst, int dlen, EC_KEY *eckey)
{
    ECDSA_SIG *newsig = NULL, *ret = NULL;
    BIGNUM *md = NULL;
    BIGNUM *order = NULL;
    const EC_GROUP *group;
    const BIGNUM *priv_key;
    BIGNUM *r = NULL, *s = NULL, *X = NULL, *tmp = NULL, *tmp2 = NULL,
        *k = NULL, *e = NULL;

    BIGNUM *new_r = NULL, *new_s = NULL;

    EC_POINT *C = NULL;
    BN_CTX *ctx;

    OPENSSL_assert(dgst != NULL && eckey != NULL);

    if (!(ctx = BN_CTX_secure_new())) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    BN_CTX_start(ctx);
    OPENSSL_assert(dlen == 32 || dlen == 64);
    md = BN_lebin2bn(dgst, dlen, NULL);
    newsig = ECDSA_SIG_new();
    if (!newsig || !md) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    group = EC_KEY_get0_group(eckey);
    if (!group) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
        goto err;
    }
    order = BN_CTX_get(ctx);
    if (!order || !EC_GROUP_get_order(group, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
        goto err;
    }
    priv_key = EC_KEY_get0_private_key(eckey);
    if (!priv_key) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
        goto err;
    }
    e = BN_CTX_get(ctx);
    if (!e || !BN_mod(e, md, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
        goto err;
    }
#ifdef DEBUG_SIGN
    fprintf(stderr, "digest as bignum=");
    BN_print_fp(stderr, md);
    fprintf(stderr, "\ndigest mod q=");
    BN_print_fp(stderr, e);
    fprintf(stderr, "\n");
#endif
    if (BN_is_zero(e)) {
        BN_one(e);
    }
    k = BN_CTX_get(ctx);
    C = EC_POINT_new(group);
    if (!k || !C) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    do {
        do {
            if (!BN_rand_range(k, order)) {
                GOSTerr(GOST_F_GOST_EC_SIGN, GOST_R_RNG_ERROR);
                goto err;
            }
            if (!gost_ec_point_mul(group, C, k, NULL, NULL, ctx)) {
                GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_EC_LIB);
                goto err;
            }
            if (!X)
                X = BN_CTX_get(ctx);
            if (!r)
                r = BN_CTX_get(ctx);
            if (!X || !r) {
                GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
                goto err;
            }
            if (!EC_POINT_get_affine_coordinates(group, C, X, NULL, ctx)) {
                GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_EC_LIB);
                goto err;
            }

            if (!BN_nnmod(r, X, order, ctx)) {
                GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
                goto err;
            }
        }
        while (BN_is_zero(r));
        /* s =  (r*priv_key+k*e) mod order */
        if (!tmp)
            tmp = BN_CTX_get(ctx);
        if (!tmp2)
            tmp2 = BN_CTX_get(ctx);
        if (!s)
            s = BN_CTX_get(ctx);
        if (!tmp || !tmp2 || !s) {
            GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
            goto err;
        }

        if (!BN_mod_mul(tmp, priv_key, r, order, ctx)
            || !BN_mod_mul(tmp2, k, e, order, ctx)
            || !BN_mod_add(s, tmp, tmp2, order, ctx)) {
            GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_INTERNAL_ERROR);
            goto err;
        }
    }
    while (BN_is_zero(s));

    new_s = BN_dup(s);
    new_r = BN_dup(r);
    if (!new_s || !new_r) {
        GOSTerr(GOST_F_GOST_EC_SIGN, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    ECDSA_SIG_set0(newsig, new_r, new_s);

    ret = newsig;
 err:
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    if (C)
        EC_POINT_free(C);
    if (md)
        BN_free(md);
    if (!ret && newsig) {
        ECDSA_SIG_free(newsig);
    }
    return ret;
}